

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_32x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  short sVar15;
  short sVar17;
  undefined1 auVar16 [16];
  short sVar18;
  ushort uVar19;
  ushort uVar20;
  short sVar21;
  ushort uVar22;
  ushort uVar23;
  short sVar24;
  ushort uVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  ushort uVar29;
  short sVar30;
  ushort uVar31;
  ushort uVar32;
  short sVar33;
  ushort uVar34;
  ushort uVar35;
  short sVar36;
  ushort uVar37;
  ushort uVar38;
  short sVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar42 [16];
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  
  auVar16 = pshuflw(ZEXT116(top_row[0x1f]),ZEXT116(top_row[0x1f]),0);
  sVar15 = auVar16._0_2_;
  sVar17 = auVar16._2_2_;
  uVar12 = 0;
  do {
    uVar1 = *(ulong *)(left_column + uVar12);
    auVar2._8_6_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2[0xe] = (char)(uVar1 >> 0x38);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xc] = (char)(uVar1 >> 0x30);
    auVar3._13_2_ = auVar2._13_2_;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5._8_2_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[10] = (char)(uVar1 >> 0x28);
    auVar5._11_4_ = auVar4._11_4_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = (char)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._9_6_ = auVar6._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar7._8_7_;
    auVar10._1_8_ = SUB158(auVar9 << 0x40,7);
    auVar10[0] = (char)(uVar1 >> 0x18);
    auVar10._9_6_ = 0;
    auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
    auVar11[0] = (char)(uVar1 >> 0x10);
    auVar11._11_4_ = 0;
    auVar8[2] = (char)(uVar1 >> 8);
    auVar8._0_2_ = (ushort)uVar1;
    auVar8._3_12_ = SUB1512(auVar11 << 0x20,3);
    auVar16._0_2_ = (ushort)uVar1 & 0xff;
    auVar16._2_13_ = auVar8._2_13_;
    auVar16[0xf] = 0;
    uVar13 = 0xfefdfefe;
    do {
      uVar13 = uVar13 + 0x2020202;
      auVar42._4_4_ = uVar13;
      auVar42._0_4_ = uVar13;
      auVar42._8_4_ = uVar13;
      auVar42._12_4_ = uVar13;
      auVar42 = pshufb(auVar16,auVar42);
      sVar18 = auVar42._0_2_;
      sVar21 = auVar42._2_2_;
      sVar24 = auVar42._4_2_;
      sVar27 = auVar42._6_2_;
      sVar30 = auVar42._8_2_;
      sVar33 = auVar42._10_2_;
      sVar36 = auVar42._12_2_;
      sVar39 = auVar42._14_2_;
      uVar19 = sVar18 * 0xff + sVar15 + 0x80;
      uVar22 = sVar21 * 0xf0 + sVar17 * 0x10 + 0x80;
      uVar25 = sVar24 * 0xe1 + sVar15 * 0x1f + 0x80;
      uVar28 = sVar27 * 0xd2 + sVar17 * 0x2e + 0x80;
      uVar31 = sVar30 * 0xc4 + sVar15 * 0x3c + 0x80;
      uVar34 = sVar33 * 0xb6 + sVar17 * 0x4a + 0x80;
      uVar37 = sVar36 * 0xa9 + sVar15 * 0x57 + 0x80;
      uVar40 = sVar39 * 0x9d + sVar17 * 99 + 0x80;
      uVar43 = sVar18 * 0x91 + sVar15 * 0x6f + 0x80;
      uVar45 = sVar21 * 0x85 + sVar17 * 0x7b + 0x80;
      uVar47 = sVar24 * 0x7a + sVar15 * 0x86 + 0x80;
      uVar49 = sVar27 * 0x6f + sVar17 * 0x91 + 0x80;
      uVar51 = sVar30 * 0x65 + sVar15 * 0x9b + 0x80;
      uVar53 = sVar33 * 0x5c + sVar17 * 0xa4 + 0x80;
      uVar55 = sVar36 * 0x53 + sVar15 * 0xad + 0x80;
      uVar57 = sVar39 * 0x4a + sVar17 * 0xb6 + 0x80;
      uVar20 = uVar19 >> 8;
      uVar23 = uVar22 >> 8;
      uVar26 = uVar25 >> 8;
      uVar29 = uVar28 >> 8;
      uVar32 = uVar31 >> 8;
      uVar35 = uVar34 >> 8;
      uVar38 = uVar37 >> 8;
      uVar41 = uVar40 >> 8;
      uVar44 = uVar43 >> 8;
      uVar46 = uVar45 >> 8;
      uVar48 = uVar47 >> 8;
      uVar50 = uVar49 >> 8;
      uVar52 = uVar51 >> 8;
      uVar54 = uVar53 >> 8;
      uVar56 = uVar55 >> 8;
      uVar58 = uVar57 >> 8;
      *dst = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
      dst[1] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      dst[2] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      dst[3] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
      dst[4] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      dst[5] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
      dst[6] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
      dst[7] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
      dst[8] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
      dst[9] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[10] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[0xb] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
      dst[0xc] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
      dst[0xd] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
      dst[0xe] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
      dst[0xf] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
      uVar19 = sVar18 * 0x42 + sVar15 * 0xbe + 0x80;
      uVar22 = sVar21 * 0x3b + sVar17 * 0xc5 + 0x80;
      uVar25 = sVar24 * 0x34 + sVar15 * 0xcc + 0x80;
      uVar28 = sVar27 * 0x2d + sVar17 * 0xd3 + 0x80;
      uVar31 = sVar30 * 0x27 + sVar15 * 0xd9 + 0x80;
      uVar34 = sVar33 * 0x22 + sVar17 * 0xde + 0x80;
      uVar37 = sVar36 * 0x1d + sVar15 * 0xe3 + 0x80;
      uVar40 = sVar39 * 0x19 + sVar17 * 0xe7 + 0x80;
      uVar43 = sVar18 * 0x15 + sVar15 * 0xeb + 0x80;
      uVar45 = sVar21 * 0x11 + sVar17 * 0xef + 0x80;
      uVar47 = sVar24 * 0xe + sVar15 * 0xf2 + 0x80;
      uVar49 = sVar27 * 0xc + sVar17 * 0xf4 + 0x80;
      uVar51 = sVar30 * 10 + sVar15 * 0xf6 + 0x80;
      uVar53 = sVar33 * 9 + sVar17 * 0xf7 + 0x80;
      uVar55 = sVar36 * 8 + sVar15 * 0xf8 + 0x80;
      uVar57 = sVar39 * 8 + sVar17 * 0xf8 + 0x80;
      uVar20 = uVar19 >> 8;
      uVar23 = uVar22 >> 8;
      uVar26 = uVar25 >> 8;
      uVar29 = uVar28 >> 8;
      uVar32 = uVar31 >> 8;
      uVar35 = uVar34 >> 8;
      uVar38 = uVar37 >> 8;
      uVar41 = uVar40 >> 8;
      uVar44 = uVar43 >> 8;
      uVar46 = uVar45 >> 8;
      uVar48 = uVar47 >> 8;
      uVar50 = uVar49 >> 8;
      uVar52 = uVar51 >> 8;
      uVar54 = uVar53 >> 8;
      uVar56 = uVar55 >> 8;
      uVar58 = uVar57 >> 8;
      dst[0x10] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
      dst[0x11] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      dst[0x12] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      dst[0x13] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
      dst[0x14] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      dst[0x15] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
      dst[0x16] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
      dst[0x17] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
      dst[0x18] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
      dst[0x19] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[0x1a] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[0x1b] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
      dst[0x1c] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
      dst[0x1d] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
      dst[0x1e] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
      dst[0x1f] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
      dst = dst + stride;
    } while (uVar13 < 0xd0c0d0d);
    bVar14 = uVar12 < 0x38;
    uVar12 = uVar12 + 8;
  } while (bVar14);
  return;
}

Assistant:

void aom_smooth_h_predictor_32x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3,
                                     weights4, scaled_top_right3,
                                     scaled_top_right4, round);
      dst += stride;
    }
  }
}